

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.cpp
# Opt level: O3

ARTKey __thiscall
duckdb::ARTKey::CreateARTKey<duckdb::string_t>
          (ARTKey *this,ArenaAllocator *allocator,string_t value)

{
  long lVar1;
  data_ptr_t data;
  ulong uVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  idx_t len;
  uint uVar6;
  undefined8 local_40;
  long local_38;
  ARTKey local_30;
  
  local_38 = value.value._0_8_;
  uVar6 = (uint)allocator;
  lVar3 = value.value._0_8_;
  if (uVar6 < 0xd) {
    lVar3 = (long)&local_40 + 4;
  }
  local_40 = allocator;
  if (uVar6 == 0) {
    len = 1;
    data = ArenaAllocator::Allocate((ArenaAllocator *)this,1);
  }
  else {
    uVar5 = (ulong)allocator & 0xffffffff;
    lVar1 = 0;
    uVar2 = 0;
    do {
      lVar1 = lVar1 + (ulong)(*(byte *)(lVar3 + uVar2) < 2);
      uVar2 = uVar2 + 1;
    } while (uVar5 != uVar2);
    len = uVar5 + lVar1 + 1;
    data = ArenaAllocator::Allocate((ArenaAllocator *)this,len);
    if (uVar6 != 0) {
      uVar2 = 0;
      lVar1 = 0;
      do {
        bVar4 = *(byte *)(lVar3 + uVar2);
        if (bVar4 < 2) {
          data[lVar1] = '\x01';
          lVar1 = lVar1 + 1;
          bVar4 = *(byte *)(lVar3 + uVar2);
        }
        data[lVar1] = bVar4;
        lVar1 = lVar1 + 1;
        uVar2 = uVar2 + 1;
      } while (uVar5 != uVar2);
      goto LAB_00c0a2f6;
    }
  }
  lVar1 = 0;
LAB_00c0a2f6:
  data[lVar1] = '\0';
  ARTKey(&local_30,data,len);
  return local_30;
}

Assistant:

ARTKey ARTKey::CreateARTKey(ArenaAllocator &allocator, string_t value) {
	auto string_data = const_data_ptr_cast(value.GetData());
	auto string_len = value.GetSize();

	// We escape \00 and \01.
	idx_t escape_count = 0;
	for (idx_t i = 0; i < string_len; i++) {
		if (string_data[i] <= 1) {
			escape_count++;
		}
	}

	idx_t key_len = string_len + escape_count + 1;
	auto key_data = allocator.Allocate(key_len);

	// Copy over the data and add escapes.
	idx_t pos = 0;
	for (idx_t i = 0; i < string_len; i++) {
		if (string_data[i] <= 1) {
			// Add escape.
			key_data[pos++] = '\01';
		}
		key_data[pos++] = string_data[i];
	}

	// End with a null-terminator.
	key_data[pos] = '\0';
	return ARTKey(key_data, key_len);
}